

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&> __thiscall
kj::
HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
::find<capnp::_::(anonymous_namespace)::TestVat*>
          (HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
           *this,TestVat **key)

{
  TestVatBase *pTVar1;
  TestNetwork **ppTVar2;
  TestVat **in_RDX;
  ArrayPtr<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
  table;
  HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
  local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(key + 4);
  table.size_ = (size_t)*key;
  HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
  ::
  find<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Entry,capnp::_::(anonymous_namespace)::TestVat*&>
            (local_28,table,in_RDX);
  if (local_28[0] ==
      (HashIndex<kj::HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>::Callbacks>
       )0x1) {
    pTVar1 = &(*key)->super_TestVatBase + local_20 * 2;
  }
  else {
    pTVar1 = (TestVatBase *)0x0;
  }
  ppTVar2 = (TestNetwork **)(pTVar1 + 1);
  if (pTVar1 == (TestVatBase *)0x0) {
    ppTVar2 = (TestNetwork **)0x0;
  }
  *(TestNetwork ***)this = ppTVar2;
  return (Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&>)(ConnectionImpl **)this
  ;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}